

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMisc.c
# Opt level: O2

void free_array2(void **p,int height)

{
  ulong uVar1;
  ulong uVar2;
  
  if (p != (void **)0x0) {
    uVar2 = 0;
    uVar1 = (ulong)(uint)height;
    if (height < 1) {
      uVar1 = uVar2;
    }
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      free(p[uVar2]);
      p[uVar2] = (void *)0x0;
    }
    free(p);
    return;
  }
  return;
}

Assistant:

void free_array2(void** p, int height)	
{
	int i = 0;

	if (p == NULL)	
	{
		return;
	}

	for (i = 0; i < height; i++)	
	{
		free(p[i]); p[i] = NULL;
	}
	free(p); p = NULL;
}